

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

int __thiscall ON_Interval::Clamp(ON_Interval *this,double *v)

{
  bool bVar1;
  uint local_1c;
  int rval;
  double *v_local;
  ON_Interval *this_local;
  
  if (this->m_t[0] <= *v) {
    bVar1 = this->m_t[1] <= *v && *v != this->m_t[1];
    if (bVar1) {
      *v = this->m_t[1];
    }
    local_1c = (uint)bVar1;
  }
  else {
    *v = this->m_t[0];
    local_1c = 0xffffffff;
  }
  return local_1c;
}

Assistant:

int 
ON_Interval::Clamp(double& v) const
{
  int rval = 0;
  if (v < m_t[0]) {
    v = m_t[0];
    rval = -1;
  }
  else if (v > m_t[1]) {
    v = m_t[1];
    rval = 1;
  }
  return rval;
}